

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::scgi::scgi(scgi *this,service *srv)

{
  service *psVar1;
  
  connection::connection(&this->super_connection,srv);
  (this->super_connection)._vptr_connection = (_func_int **)&PTR__scgi_002b8b30;
  this->start_ = 0;
  this->end_ = 0;
  psVar1 = cppcms::service::impl(srv);
  booster::aio::stream_socket::stream_socket
            (&this->socket_,
             (psVar1->io_service_)._M_t.
             super___uniq_ptr_impl<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>
             ._M_t.
             super__Tuple_impl<0UL,_booster::aio::io_service_*,_std::default_delete<booster::aio::io_service>_>
             .super__Head_base<0UL,_booster::aio::io_service_*,_false>._M_head_impl);
  (this->headers_)._M_dataplus._M_p = (pointer)&(this->headers_).field_2;
  (this->headers_)._M_string_length = 0;
  (this->headers_).field_2._M_local_buf[0] = '\0';
  this->headers_written_ = false;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

scgi(cppcms::service &srv) :
			connection(srv),
			start_(0),
			end_(0),
			socket_(srv.impl().get_io_service()),
			headers_written_(false),
			eof_callback_(false)
		{
		}